

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_Mesh * __thiscall
ON_Mesh::CopyComponents
          (ON_Mesh *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count,ON_Mesh *destination_mesh)

{
  ON_COMPONENT_INDEX *pOVar1;
  double *pdVar2;
  uint count;
  uint count_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ON_MeshTopologyEdge *pOVar6;
  ON_MeshTopologyVertex *pOVar7;
  ON_MeshFace *pOVar8;
  undefined8 uVar9;
  uint *puVar10;
  double dVar11;
  float fVar12;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  uint *puVar16;
  uint *puVar17;
  ulong uVar18;
  ON_MeshFace *pOVar19;
  ON_3fVector *pOVar20;
  ON_3fPoint *pOVar21;
  ON_3dPoint *pOVar22;
  ON_2dPoint *pOVar23;
  ON_3fVector *pOVar24;
  ON_2fPoint *pOVar25;
  ON_SurfaceCurvature *pOVar26;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar27;
  ON_MeshNgon *pOVar28;
  ON_MeshNgon *ngon;
  uint *puVar29;
  ulong uVar30;
  ulong uVar31;
  ON_SurfaceCurvature *pOVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  size_t ci_index;
  size_t sVar36;
  long lVar37;
  ON_MeshTopology *top;
  ON_COMPONENT_INDEX ci;
  ON_SimpleArray<unsigned_int> vertex_map_buffer;
  ON_SimpleArray<unsigned_int> face_map_buffer;
  ON_MeshNgonBuffer ngon_buffer;
  ON_SurfaceCurvature *local_150;
  ON_SurfaceCurvature *local_148;
  ON_SurfaceCurvature *local_140;
  ON_SurfaceCurvature *local_138;
  ON_Mesh *local_128;
  ON_3dPoint *local_110;
  undefined1 local_108 [12];
  int iStack_fc;
  ON_3fPoint *local_f0;
  ON_SimpleArray<unsigned_int> local_e8;
  ON_SimpleArray<ON_Color> *local_d0;
  ON_SimpleArray<ON_SurfaceCurvature> *local_c8;
  ON_SimpleArray<ON_2fPoint> *local_c0;
  ON_SimpleArray<ON_3fVector> *local_b8;
  ON_SimpleArray<ON_2dPoint> *local_b0;
  ON_SimpleArray<ON_3dPoint> *local_a8;
  ON_SimpleArray<ON_3fPoint> *local_a0;
  ON_SimpleArray<unsigned_int> local_98;
  ON_MeshNgonBuffer local_80;
  
  if (ci_list == (ON_COMPONENT_INDEX *)0x0 || ci_count == 0) {
    return (ON_Mesh *)0x0;
  }
  count = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar31 = (ulong)count;
  count_00 = (this->m_F).m_count;
  uVar30 = (ulong)count_00;
  uVar34 = 0;
  if (count_00 == 0 && count == 0) {
    return (ON_Mesh *)0x0;
  }
  if ((this->m_top).m_b32IsValid == 1) {
    local_140 = (ON_SurfaceCurvature *)&this->m_top;
    if ((this->m_top).m_b32IsValid == 0) {
      (this->m_top).m_mesh = this;
      bVar13 = ON_MeshTopology::Create((ON_MeshTopology *)local_140);
      (this->m_top).m_b32IsValid = (uint)bVar13;
    }
    uVar34 = (this->m_top).m_topv.m_count;
    uVar35 = (this->m_top).m_tope.m_count;
  }
  else {
    local_140 = (ON_SurfaceCurvature *)0x0;
    uVar35 = 0;
  }
  local_e8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
  local_e8.m_a = (uint *)0x0;
  local_e8.m_count = 0;
  local_e8.m_capacity = 0;
  local_98._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
  local_98.m_a = (uint *)0x0;
  local_98.m_count = 0;
  local_98.m_capacity = 0;
  ON_MeshNgonBuffer::ON_MeshNgonBuffer(&local_80);
  puVar17 = (uint *)0x0;
  puVar16 = (uint *)0x0;
  sVar36 = 0;
  do {
    local_108._0_8_ = ci_list[sVar36];
    bVar13 = ON_COMPONENT_INDEX::IsMeshComponentIndex((ON_COMPONENT_INDEX *)local_108);
    if (bVar13) {
      lVar33 = (long)(int)local_108._4_4_;
      if (-1 < lVar33) {
        switch(local_108._0_4_) {
        case 0xb:
          if ((uint)local_108._4_4_ < count) {
            if (puVar17 == (uint *)0x0) {
              puVar17 = InitializeMap(count,&local_e8);
            }
            puVar17[lVar33] = 0;
          }
          break;
        case 0xc:
          if ((((uint)local_108._4_4_ < uVar34) &&
              (pOVar7 = ((ON_SimpleArray<ON_MeshTopologyVertex> *)((long)local_140 + 0x20))->m_a,
              pOVar7[lVar33].m_vi != (int *)0x0)) && (iVar14 = pOVar7[lVar33].m_v_count, 0 < iVar14)
             ) {
            lVar37 = 0;
            do {
              uVar3 = pOVar7[lVar33].m_vi[lVar37];
              if (uVar3 < count && -1 < (int)uVar3) {
                if (puVar17 == (uint *)0x0) {
                  puVar17 = InitializeMap(count,&local_e8);
                }
                puVar17[uVar3] = 0;
                iVar14 = pOVar7[lVar33].m_v_count;
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < iVar14);
          }
          break;
        case 0xd:
          if ((((uint)local_108._4_4_ < uVar35) &&
              (pOVar6 = ((ON_SimpleArray<ON_MeshTopologyEdge> *)((long)local_140 + 0x38))->m_a,
              pOVar6[lVar33].m_topfi != (int *)0x0)) &&
             (iVar14 = pOVar6[lVar33].m_topf_count, 0 < iVar14)) {
            lVar37 = 0;
            do {
              uVar3 = pOVar6[lVar33].m_topfi[lVar37];
              if (uVar3 < count_00 && -1 < (int)uVar3) {
                if (puVar16 == (uint *)0x0) {
                  puVar16 = InitializeMap(count_00,&local_98);
                }
                puVar16[uVar3] = 0;
                iVar14 = pOVar6[lVar33].m_topf_count;
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < iVar14);
          }
          break;
        case 0xe:
        case 0xf:
          pOVar28 = NgonFromComponentIndex(this,&local_80,(ON_COMPONENT_INDEX)local_108._0_8_);
          if (pOVar28 != (ON_MeshNgon *)0x0) {
            if ((pOVar28->m_vi != (uint *)0x0) &&
               (uVar15 = (ulong)pOVar28->m_Vcount, pOVar28->m_Vcount != 0)) {
              uVar18 = 0;
              do {
                uVar3 = pOVar28->m_vi[uVar18];
                if (uVar3 < count) {
                  if (puVar17 == (uint *)0x0) {
                    puVar17 = InitializeMap(count,&local_e8);
                  }
                  puVar17[uVar3] = 0;
                  uVar15 = (ulong)pOVar28->m_Vcount;
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < uVar15);
            }
            if ((pOVar28->m_fi != (uint *)0x0) &&
               (uVar15 = (ulong)pOVar28->m_Fcount, pOVar28->m_Fcount != 0)) {
              uVar18 = 0;
              do {
                uVar3 = pOVar28->m_fi[uVar18];
                if (uVar3 < count_00) {
                  if (puVar16 == (uint *)0x0) {
                    puVar16 = InitializeMap(count_00,&local_98);
                  }
                  puVar16[uVar3] = 0;
                  uVar15 = (ulong)pOVar28->m_Fcount;
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < uVar15);
            }
          }
        }
      }
    }
    sVar36 = sVar36 + 1;
  } while (sVar36 != ci_count);
  uVar15 = 0;
  if (uVar30 != 0 && puVar16 != (uint *)0x0) {
    lVar33 = 0;
    uVar15 = 0;
    do {
      if (*(int *)((long)puVar16 + lVar33) == 0) {
        pOVar1 = (ON_COMPONENT_INDEX *)(((this->m_F).m_a)->vi + lVar33);
        local_108._0_8_ = *pOVar1;
        unique0x100005f4 = pOVar1[1];
        bVar13 = ON_MeshFace::IsValid((ON_MeshFace *)local_108,count);
        if (bVar13) {
          *(int *)((long)puVar16 + lVar33) = (int)uVar15;
          if (puVar17 == (uint *)0x0) {
            puVar17 = InitializeMap(count,&local_e8);
          }
          uVar15 = (ulong)((int)uVar15 + 1);
          puVar17[(int)local_108._0_4_] = 0;
          puVar17[(int)local_108._4_4_] = 0;
          puVar17[(int)local_108._8_4_] = 0;
          puVar17[iStack_fc] = 0;
        }
        else {
          *(undefined4 *)((long)puVar16 + lVar33) = 0xffffffff;
        }
      }
      lVar33 = lVar33 + 4;
    } while (uVar30 * 4 - lVar33 != 0);
  }
  if ((puVar17 != (uint *)0x0) && (uVar34 = 0, uVar31 != 0)) {
    uVar18 = 0;
    do {
      if (puVar17[uVar18] == 0) {
        puVar17[uVar18] = uVar34;
        uVar34 = uVar34 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar31 != uVar18);
    if (uVar34 != 0) {
      if (destination_mesh == (ON_Mesh *)0x0) {
        local_128 = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh(local_128);
      }
      else {
        Destroy(destination_mesh);
        local_128 = destination_mesh;
      }
      if ((int)uVar15 != 0) {
        pOVar8 = (this->m_F).m_a;
        if ((ulong)(long)(local_128->m_F).m_capacity < uVar15) {
          ON_SimpleArray<ON_MeshFace>::SetCapacity(&local_128->m_F,uVar15);
        }
        iVar14 = (this->m_F).m_count;
        pOVar24 = (ON_3fVector *)0x0;
        bVar13 = true;
        if ((0 < iVar14) &&
           (bVar13 = true, (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar14)) {
          pOVar24 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a;
          if (pOVar24 == (ON_3fVector *)0x0) {
            pOVar24 = (ON_3fVector *)0x0;
          }
          else {
            if ((ulong)(long)(local_128->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar15
               ) {
              ON_SimpleArray<ON_3fVector>::SetCapacity
                        (&(local_128->m_FN).super_ON_SimpleArray<ON_3fVector>,uVar15);
            }
            bVar13 = false;
          }
        }
        if (uVar30 != 0) {
          lVar33 = 0;
          do {
            if (*(int *)((long)puVar16 + lVar33) != -1) {
              pOVar19 = ON_SimpleArray<ON_MeshFace>::AppendNew(&local_128->m_F);
              pOVar19->vi[0] = puVar17[(uint)pOVar8->vi[lVar33]];
              pOVar19->vi[1] = puVar17[(uint)pOVar8->vi[lVar33 + 1]];
              pOVar19->vi[2] = puVar17[(uint)pOVar8->vi[lVar33 + 2]];
              pOVar19->vi[3] = puVar17[(uint)pOVar8->vi[lVar33 + 3]];
              if (!bVar13) {
                pOVar20 = ON_SimpleArray<ON_3fVector>::AppendNew
                                    (&(local_128->m_FN).super_ON_SimpleArray<ON_3fVector>);
                pOVar20->z = pOVar24->z;
                fVar12 = pOVar24->y;
                pOVar20->x = pOVar24->x;
                pOVar20->y = fVar12;
              }
            }
            lVar33 = lVar33 + 4;
            pOVar24 = pOVar24 + 1;
          } while (uVar30 * 4 != lVar33);
        }
      }
      iVar14 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      pOVar26 = (ON_SurfaceCurvature *)0x0;
      local_110 = (ON_3dPoint *)0x0;
      if (iVar14 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
        local_110 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
      }
      local_148 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar14) {
        local_148 = (ON_SurfaceCurvature *)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
      }
      local_150 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar14) {
        local_150 = (ON_SurfaceCurvature *)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      }
      local_138 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar14) {
        local_138 = (ON_SurfaceCurvature *)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      }
      local_140 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_K).m_count == iVar14) {
        local_140 = (this->m_K).m_a;
      }
      local_f0 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      pOVar32 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_C).m_count == iVar14) {
        pOVar32 = (ON_SurfaceCurvature *)(this->m_C).m_a;
      }
      if (iVar14 < 1) {
        pOVar32 = pOVar26;
        local_138 = pOVar26;
        local_140 = pOVar26;
        local_148 = pOVar26;
        local_150 = pOVar26;
      }
      uVar30 = (ulong)uVar34;
      if ((local_f0 != (ON_3fPoint *)0x0) &&
         ((ulong)(long)(local_128->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < uVar30)) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity
                  (&(local_128->m_V).super_ON_SimpleArray<ON_3fPoint>,uVar30);
      }
      if ((local_110 != (ON_3dPoint *)0x0) &&
         ((ulong)(long)(local_128->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar30)) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity
                  (&(local_128->m_dV).super_ON_SimpleArray<ON_3dPoint>,uVar30);
      }
      if ((local_148 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(local_128->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar30)) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&(local_128->m_S).super_ON_SimpleArray<ON_2dPoint>,uVar30);
      }
      if ((local_150 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(local_128->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar30)) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&(local_128->m_N).super_ON_SimpleArray<ON_3fVector>,uVar30);
      }
      if ((local_138 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(local_128->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar30)) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&(local_128->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar30);
      }
      if ((local_140 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(local_128->m_K).m_capacity < uVar30)) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&local_128->m_K,uVar30);
      }
      if ((pOVar32 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(local_128->m_C).m_capacity < uVar30)) {
        ON_SimpleArray<ON_Color>::SetCapacity(&local_128->m_C,uVar30);
      }
      if (uVar31 != 0) {
        local_a0 = &(local_128->m_V).super_ON_SimpleArray<ON_3fPoint>;
        local_a8 = &(local_128->m_dV).super_ON_SimpleArray<ON_3dPoint>;
        local_b0 = &(local_128->m_S).super_ON_SimpleArray<ON_2dPoint>;
        local_b8 = &(local_128->m_N).super_ON_SimpleArray<ON_3fVector>;
        local_c0 = &(local_128->m_T).super_ON_SimpleArray<ON_2fPoint>;
        local_c8 = &local_128->m_K;
        local_d0 = &local_128->m_C;
        lVar37 = 0;
        lVar33 = 0;
        do {
          if (*(int *)((long)puVar17 + lVar33) != -1) {
            if (local_f0 != (ON_3fPoint *)0x0) {
              pOVar21 = ON_SimpleArray<ON_3fPoint>::AppendNew(local_a0);
              pOVar21->z = *(float *)((long)&local_f0->z + lVar37);
              uVar9 = *(undefined8 *)((long)&local_f0->x + lVar37);
              pOVar21->x = (float)(int)uVar9;
              pOVar21->y = (float)(int)((ulong)uVar9 >> 0x20);
            }
            if (local_110 != (ON_3dPoint *)0x0) {
              pOVar22 = ON_SimpleArray<ON_3dPoint>::AppendNew(local_a8);
              pOVar22->z = *(double *)((long)&local_110->z + lVar37 * 2);
              pdVar2 = (double *)((long)&local_110->x + lVar37 * 2);
              dVar11 = pdVar2[1];
              pOVar22->x = *pdVar2;
              pOVar22->y = dVar11;
            }
            if (local_148 != (ON_SurfaceCurvature *)0x0) {
              pOVar23 = ON_SimpleArray<ON_2dPoint>::AppendNew(local_b0);
              pdVar2 = (double *)((long)&local_148->k1 + lVar33 * 4);
              dVar11 = pdVar2[1];
              pOVar23->x = *pdVar2;
              pOVar23->y = dVar11;
            }
            if (local_150 != (ON_SurfaceCurvature *)0x0) {
              pOVar24 = ON_SimpleArray<ON_3fVector>::AppendNew(local_b8);
              pOVar24->z = *(float *)((long)&local_150->k2 + lVar37);
              uVar9 = *(undefined8 *)((long)&local_150->k1 + lVar37);
              pOVar24->x = (float)(int)uVar9;
              pOVar24->y = (float)(int)((ulong)uVar9 >> 0x20);
            }
            if (local_138 != (ON_SurfaceCurvature *)0x0) {
              pOVar25 = ON_SimpleArray<ON_2fPoint>::AppendNew(local_c0);
              *pOVar25 = *(ON_2fPoint *)((long)&local_138->k1 + lVar33 * 2);
            }
            if (local_140 != (ON_SurfaceCurvature *)0x0) {
              pOVar26 = ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(local_c8);
              pdVar2 = (double *)((long)&local_140->k1 + lVar33 * 4);
              dVar11 = pdVar2[1];
              pOVar26->k1 = *pdVar2;
              pOVar26->k2 = dVar11;
            }
            if (pOVar32 != (ON_SurfaceCurvature *)0x0) {
              paVar27 = &ON_SimpleArray<ON_Color>::AppendNew(local_d0)->field_0;
              *paVar27 = *(anon_union_4_2_6147a14e_for_ON_Color_15 *)((long)&pOVar32->k1 + lVar33);
            }
          }
          lVar33 = lVar33 + 4;
          lVar37 = lVar37 + 0xc;
        } while (uVar31 << 2 != lVar33);
      }
      uVar34 = NgonCount(this);
      if (uVar34 != 0) {
        uVar35 = 0;
        do {
          pOVar28 = Ngon(this,uVar35);
          if (pOVar28 != (ON_MeshNgon *)0x0) {
            uVar3 = pOVar28->m_Vcount;
            if (((ulong)uVar3 != 0) && (pOVar28->m_vi != (uint *)0x0)) {
              uVar4 = pOVar28->m_Fcount;
              if (((ulong)uVar4 != 0) && (pOVar28->m_fi != (uint *)0x0)) {
                uVar31 = 0;
                do {
                  uVar5 = pOVar28->m_vi[uVar31];
                  if ((count <= uVar5) || (puVar17[uVar5] == 0xffffffff)) goto LAB_00514681;
                  uVar31 = uVar31 + 1;
                } while (uVar3 != uVar31);
                uVar31 = 0;
                do {
                  uVar5 = pOVar28->m_fi[uVar31];
                  if ((count_00 <= uVar5) || (puVar16[uVar5] == 0xffffffff)) goto LAB_00514681;
                  uVar31 = uVar31 + 1;
                } while (uVar4 != uVar31);
                ngon = AllocateNgon(local_128,uVar3,uVar4);
                ngon->m_Vcount = 0;
                ngon->m_Fcount = 0;
                if (pOVar28->m_Vcount != 0) {
                  puVar29 = pOVar28->m_vi;
                  puVar10 = ngon->m_vi;
                  uVar31 = 0;
                  do {
                    uVar3 = puVar17[puVar29[uVar31]];
                    uVar4 = ngon->m_Vcount;
                    ngon->m_Vcount = uVar4 + 1;
                    puVar10[uVar4] = uVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar31 < pOVar28->m_Vcount);
                }
                if (pOVar28->m_Fcount != 0) {
                  puVar29 = pOVar28->m_fi;
                  puVar10 = ngon->m_fi;
                  uVar31 = 0;
                  do {
                    uVar3 = puVar16[puVar29[uVar31]];
                    uVar4 = ngon->m_Fcount;
                    ngon->m_Fcount = uVar4 + 1;
                    puVar10[uVar4] = uVar3;
                    uVar31 = uVar31 + 1;
                  } while (uVar31 < pOVar28->m_Fcount);
                }
                AddNgon(local_128,ngon);
                puVar29 = NgonMap(this);
                if (puVar29 != (uint *)0x0) {
                  CreateNgonMap(local_128);
                }
              }
            }
          }
LAB_00514681:
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar34);
      }
      goto LAB_00514045;
    }
  }
  local_128 = (ON_Mesh *)0x0;
LAB_00514045:
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_98);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_e8);
  return local_128;
}

Assistant:

ON_Mesh* ON_Mesh::CopyComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count,
  class ON_Mesh* destination_mesh
  ) const
{
  if ( ci_count <= 0 || 0 == ci_list )
    return 0;

  const unsigned int vertex_count = m_V.UnsignedCount();
  const unsigned int face_count = m_F.UnsignedCount();

  if ( vertex_count <= 0 && face_count <= 0 )
    return 0;

  const ON_MeshTopology* top = TopologyExists() ? &Topology() : 0;
  const unsigned int topv_count = top ? top->m_topv.UnsignedCount() : 0;
  const unsigned int tope_count = top ? top->m_tope.UnsignedCount() : 0;
  
  ON_SimpleArray< unsigned int > vertex_map_buffer;
  ON_SimpleArray< unsigned int > face_map_buffer;

  unsigned int* vertex_map = 0;
  unsigned int* face_map = 0;
  unsigned int i, fi, vi;

  ON_MeshNgonBuffer ngon_buffer;
  
  for ( size_t ci_index = 0; ci_index < ci_count; ci_index++ )
  {
    ON_COMPONENT_INDEX ci = ci_list[ci_index];
    if ( !ci.IsMeshComponentIndex() )
      continue;
    if ( ci.m_index < 0 )
      continue;
    i = (unsigned int)ci.m_index;

    switch(ci.m_type)
    {
    case ON_COMPONENT_INDEX::mesh_vertex:
      if ( i >= vertex_count )
        break;
      if ( 0 == vertex_map )
        vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
      vertex_map[i] = 0;
      break;

    case ON_COMPONENT_INDEX::mesh_face:
    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = NgonFromComponentIndex(ngon_buffer,ci);
        if ( 0 == ngon )
          break;
        if ( 0 != ngon->m_vi )
        {
          for ( i = 0; i < ngon->m_Vcount; i++ )
          {
            vi = ngon->m_vi[i];
            if ( vi >= vertex_count )
              continue;
            if ( 0 == vertex_map )
              vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
            vertex_map[vi] = 0;
          }
        }
        if ( 0 != ngon->m_fi )
        {
          for ( i = 0; i < ngon->m_Fcount; i++ )
          {
            fi = ngon->m_fi[i];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_vertex:
      if ( i < topv_count )
      {
        const ON_MeshTopologyVertex& v = top->m_topv[i];
        if ( v.m_vi )
        {
          for ( int j = 0; j < v.m_v_count; j++ )
          {
            if ( v.m_vi[j] < 0 )
              continue;
            vi = (unsigned int)v.m_vi[j];
            if ( vi < vertex_count )
            {
              if ( 0 == vertex_map )
                vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
              vertex_map[vi] = 0;
            }
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_edge:
      if ( i < tope_count )
      {
        const ON_MeshTopologyEdge& e = top->m_tope[i];
        if ( e.m_topfi )
        {
          for ( int j = 0; j < e.m_topf_count; j++ )
          {
            if ( e.m_topfi[j] < 0 )
              continue;
            fi = (unsigned int)e.m_topfi[j];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    default:
      break;
    }
  }

  unsigned int face_count1 = 0;
  if ( 0 != face_map )
  {
    for ( i = 0; i < face_count; i++ )
    {
      if ( 0 == face_map[i] )
      {
        ON_MeshFace f = m_F[i];
        if ( f.IsValid(vertex_count) )
        {
          face_map[i] = face_count1++;
          if ( 0 == vertex_map )
            vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
          vertex_map[f.vi[0]] = 0;
          vertex_map[f.vi[1]] = 0;
          vertex_map[f.vi[2]] = 0;
          vertex_map[f.vi[3]] = 0;
        }
        else
          face_map[i] = ON_UNSET_UINT_INDEX; // bogus input face
      }
    }
  }

  if ( 0 == vertex_map )
    return 0;

  unsigned int vertex_count1 = 0;
  for ( i = 0; i < vertex_count; i++ )
  {
    if ( 0 == vertex_map[i] )
      vertex_map[i] = vertex_count1++;
  }

  if ( vertex_count1 <= 0 )
    return 0;

  ON_Mesh* mesh_copy = 0;
  if ( destination_mesh )
  {
    destination_mesh->Destroy();
    mesh_copy = destination_mesh;
  }
  else
  {
    mesh_copy = new ON_Mesh();
  }

  if ( face_count1 > 0 )
  {
    // copy face information
    const ON_MeshFace* F = m_F.Array();
    mesh_copy->m_F.Reserve(face_count1);
    const ON_3fVector* FN = HasFaceNormals() ? m_FN.Array() : 0;
    if ( 0 != FN )
      mesh_copy->m_FN.Reserve(face_count1);
    const unsigned int* fvi;
    unsigned int* fvi1;
    for ( fi = 0; fi < face_count; fi++ )
    {
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        continue;
      fvi = (const unsigned int*)F[fi].vi;
      fvi1 = (unsigned int*)(mesh_copy->m_F.AppendNew().vi);
      fvi1[0] = vertex_map[fvi[0]];
      fvi1[1] = vertex_map[fvi[1]];
      fvi1[2] = vertex_map[fvi[2]];
      fvi1[3] = vertex_map[fvi[3]];
      if ( FN )
        mesh_copy->m_FN.AppendNew() = FN[fi];
    }
  }

  const bool bValidSingles = (VertexUnsignedCount() == m_V.UnsignedCount());
  const ON_3fPoint* fV = bValidSingles ? m_V.Array() : nullptr;
  const bool bValidDoubles = (VertexUnsignedCount() == m_dV.UnsignedCount());
  const ON_3dPoint* dV = bValidDoubles ? m_dV.Array() : nullptr;
  const ON_2dPoint* S = HasSurfaceParameters() ? m_S.Array() : 0;
  const ON_3fVector* N = HasVertexNormals() ? m_N.Array() : 0;
  const ON_2fPoint* T = HasTextureCoordinates() ? m_T.Array() : 0;
  const ON_SurfaceCurvature* K = HasPrincipalCurvatures() ? m_K.Array() : 0;
  const ON_Color* C = HasVertexColors() ? m_C.Array() : 0;

  if (fV)
    mesh_copy->m_V.Reserve(vertex_count1);
  if (dV)
    mesh_copy->m_dV.Reserve(vertex_count1);
  if (S)
    mesh_copy->m_S.Reserve(vertex_count1);
  if (N)
    mesh_copy->m_N.Reserve(vertex_count1);
  if (T)
    mesh_copy->m_T.Reserve(vertex_count1);
  if (K)
    mesh_copy->m_K.Reserve(vertex_count1);
  if (C)
    mesh_copy->m_C.Reserve(vertex_count1);

  for ( vi = 0; vi < vertex_count; vi++ )
  {
    if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
      continue;
    if (fV)
      mesh_copy->m_V.AppendNew() = fV[vi];
    if (dV)
      mesh_copy->m_dV.AppendNew() = dV[vi];
    if ( S )
      mesh_copy->m_S.AppendNew() = S[vi];
    if ( N )
      mesh_copy->m_N.AppendNew() = N[vi];
    if ( T )
      mesh_copy->m_T.AppendNew() = T[vi];
    if ( K )
      mesh_copy->m_K.AppendNew() = K[vi];
    if ( C )
      mesh_copy->m_C.AppendNew() = C[vi];
  }

  const unsigned int ngon_count = NgonCount();
  for ( unsigned int ngon_index = 0; ngon_index < ngon_count; ngon_index++ )
  {
    const ON_MeshNgon* ngon = Ngon(ngon_index);
    if ( 0 == ngon )
      continue;
    if ( 0 == ngon->m_Vcount || 0 == ngon->m_vi )
      continue;
    if ( 0 == ngon->m_Fcount || 0 == ngon->m_fi )
      continue;
    
    unsigned int j;
    
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      vi = ngon->m_vi[j];
      if ( vi >= vertex_count )
        break;
      if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
        break;
    }
    if ( j < ngon->m_Vcount )
      continue;

    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      fi = ngon->m_fi[j];
      if ( fi >= face_count )
        break;
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        break;
    }
    if ( j < ngon->m_Fcount )
      continue;

    ON_MeshNgon* ngon1 = mesh_copy->AllocateNgon(ngon->m_Vcount,ngon->m_Fcount);

    ngon1->m_Vcount = 0;
    ngon1->m_Fcount = 0;
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      ngon1->m_vi[ngon1->m_Vcount++] = vertex_map[ngon->m_vi[j]];
    }
    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      ngon1->m_fi[ngon1->m_Fcount++] = face_map[ngon->m_fi[j]];
    }

    mesh_copy->AddNgon(ngon1);

    if ( 0 != NgonMap() )
      mesh_copy->CreateNgonMap();
  }

  return mesh_copy;
}